

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleRowDown38_3_Box_16_C
               (uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *dst_ptr,int dst_width)

{
  long lVar1;
  ushort *puVar2;
  
  if (0 < dst_width) {
    puVar2 = src_ptr + 7;
    lVar1 = 0;
    do {
      dst_ptr[lVar1] =
           (uint16_t)
           (((uint)puVar2[src_stride * 2 + -5] + (uint)puVar2[src_stride * 2 + -6] +
            (uint)puVar2[src_stride * 2 + -7] +
            (uint)puVar2[src_stride + -5] + (uint)puVar2[src_stride + -6] +
            (uint)puVar2[src_stride + -7] + (uint)puVar2[-5] + (uint)puVar2[-6] + (uint)puVar2[-7])
            * 0x1c71 >> 0x10);
      dst_ptr[lVar1 + 1] =
           (uint16_t)
           (((uint)puVar2[src_stride * 2 + -2] + (uint)puVar2[src_stride * 2 + -3] +
            (uint)puVar2[src_stride * 2 + -4] +
            (uint)puVar2[src_stride + -2] + (uint)puVar2[src_stride + -3] +
            (uint)puVar2[src_stride + -4] + (uint)puVar2[-2] + (uint)puVar2[-3] + (uint)puVar2[-4])
            * 0x1c71 >> 0x10);
      dst_ptr[lVar1 + 2] =
           (uint16_t)
           (((uint)puVar2[src_stride * 2] + (uint)puVar2[src_stride * 2 + -1] +
            (uint)puVar2[src_stride] + (uint)puVar2[src_stride + -1] +
            (uint)*puVar2 + (uint)puVar2[-1]) * 0x2aaa >> 0x10);
      lVar1 = lVar1 + 3;
      puVar2 = puVar2 + 8;
    } while ((int)lVar1 < dst_width);
  }
  return;
}

Assistant:

void ScaleRowDown38_3_Box_16_C(const uint16_t* src_ptr,
                               ptrdiff_t src_stride,
                               uint16_t* dst_ptr,
                               int dst_width) {
  intptr_t stride = src_stride;
  int i;
  assert((dst_width % 3 == 0) && (dst_width > 0));
  for (i = 0; i < dst_width; i += 3) {
    dst_ptr[0] =
        (src_ptr[0] + src_ptr[1] + src_ptr[2] + src_ptr[stride + 0] +
         src_ptr[stride + 1] + src_ptr[stride + 2] + src_ptr[stride * 2 + 0] +
         src_ptr[stride * 2 + 1] + src_ptr[stride * 2 + 2]) *
            (65536 / 9) >>
        16;
    dst_ptr[1] =
        (src_ptr[3] + src_ptr[4] + src_ptr[5] + src_ptr[stride + 3] +
         src_ptr[stride + 4] + src_ptr[stride + 5] + src_ptr[stride * 2 + 3] +
         src_ptr[stride * 2 + 4] + src_ptr[stride * 2 + 5]) *
            (65536 / 9) >>
        16;
    dst_ptr[2] =
        (src_ptr[6] + src_ptr[7] + src_ptr[stride + 6] + src_ptr[stride + 7] +
         src_ptr[stride * 2 + 6] + src_ptr[stride * 2 + 7]) *
            (65536 / 6) >>
        16;
    src_ptr += 8;
    dst_ptr += 3;
  }
}